

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# background_thread.c
# Opt level: O1

_Bool background_thread_boot1(tsdn_t *tsdn)

{
  pthread_mutex_t *__mutex;
  uint64_t *puVar1;
  witness_t **ppwVar2;
  _Bool _Var3;
  int iVar4;
  base_t *base;
  background_thread_info_t *pbVar5;
  ulong uVar6;
  malloc_mutex_t *mutex;
  bool bVar7;
  
  if (0xfff < opt_max_background_threads) {
    opt_max_background_threads = 4;
  }
  max_background_threads = opt_max_background_threads;
  background_thread_enabled_state.repr = opt_background_thread;
  _Var3 = malloc_mutex_init(&background_thread_lock,"background_thread_global",4,
                            malloc_mutex_rank_exclusive);
  bVar7 = true;
  if (!_Var3) {
    base = b0get();
    pbVar5 = (background_thread_info_t *)
             base_alloc(tsdn,base,opt_max_background_threads * 0xd0,0x40);
    background_thread_info = pbVar5;
    if ((pbVar5 != (background_thread_info_t *)0x0) && (bVar7 = max_background_threads != 0, bVar7))
    {
      mutex = &pbVar5->mtx;
      uVar6 = 1;
      _Var3 = malloc_mutex_init(mutex,"background_thread",0xb,malloc_mutex_address_ordered);
      while (_Var3 == false) {
        iVar4 = pthread_cond_init((pthread_cond_t *)&pbVar5->cond,(pthread_condattr_t *)0x0);
        if (iVar4 != 0) {
          return bVar7;
        }
        __mutex = (pthread_mutex_t *)((long)&(pbVar5->mtx).field_0 + 0x40);
        iVar4 = pthread_mutex_trylock(__mutex);
        if (iVar4 != 0) {
          malloc_mutex_lock_slow(mutex);
          (pbVar5->mtx).field_0.field_0.locked.repr = true;
        }
        puVar1 = &(pbVar5->mtx).field_0.field_0.prof_data.n_lock_ops;
        *puVar1 = *puVar1 + 1;
        if ((pbVar5->mtx).field_0.field_0.prof_data.prev_owner != tsdn) {
          (pbVar5->mtx).field_0.field_0.prof_data.prev_owner = tsdn;
          ppwVar2 = &(pbVar5->mtx).field_0.witness.link.qre_prev;
          *ppwVar2 = (witness_t *)((long)&(*ppwVar2)->name + 1);
        }
        pbVar5->state = background_thread_stopped;
        (pbVar5->indefinite_sleep).repr = false;
        nstime_init(&pbVar5->next_wakeup,0);
        pbVar5->npages_to_purge_new = 0;
        pbVar5->tot_n_runs = 0;
        nstime_init(&pbVar5->tot_sleep_time,0);
        (pbVar5->mtx).field_0.field_0.locked.repr = false;
        pthread_mutex_unlock(__mutex);
        bVar7 = uVar6 < max_background_threads;
        if (max_background_threads <= uVar6) {
          return bVar7;
        }
        pbVar5 = background_thread_info + uVar6;
        mutex = &background_thread_info[uVar6].mtx;
        _Var3 = malloc_mutex_init(mutex,"background_thread",0xb,malloc_mutex_address_ordered);
        uVar6 = (ulong)((int)uVar6 + 1);
      }
    }
  }
  return bVar7;
}

Assistant:

bool
background_thread_boot1(tsdn_t *tsdn) {
#ifdef JEMALLOC_BACKGROUND_THREAD
	assert(have_background_thread);
	assert(narenas_total_get() > 0);

	if (opt_max_background_threads > MAX_BACKGROUND_THREAD_LIMIT) {
		opt_max_background_threads = DEFAULT_NUM_BACKGROUND_THREAD;
	}
	max_background_threads = opt_max_background_threads;

	background_thread_enabled_set(tsdn, opt_background_thread);
	if (malloc_mutex_init(&background_thread_lock,
	    "background_thread_global",
	    WITNESS_RANK_BACKGROUND_THREAD_GLOBAL,
	    malloc_mutex_rank_exclusive)) {
		return true;
	}

	background_thread_info = (background_thread_info_t *)base_alloc(tsdn,
	    b0get(), opt_max_background_threads *
	    sizeof(background_thread_info_t), CACHELINE);
	if (background_thread_info == NULL) {
		return true;
	}

	for (unsigned i = 0; i < max_background_threads; i++) {
		background_thread_info_t *info = &background_thread_info[i];
		/* Thread mutex is rank_inclusive because of thread0. */
		if (malloc_mutex_init(&info->mtx, "background_thread",
		    WITNESS_RANK_BACKGROUND_THREAD,
		    malloc_mutex_address_ordered)) {
			return true;
		}
		if (pthread_cond_init(&info->cond, NULL)) {
			return true;
		}
		malloc_mutex_lock(tsdn, &info->mtx);
		info->state = background_thread_stopped;
		background_thread_info_init(tsdn, info);
		malloc_mutex_unlock(tsdn, &info->mtx);
	}
#endif

	return false;
}